

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper *clipper,int item_n)

{
  float pos_y;
  ImGuiListClipperData *data;
  int item_n_local;
  ImGuiListClipper *clipper_local;
  
  ImGuiListClipper_SeekCursorAndSetupPrevLine
            ((float)(item_n - *(int *)((long)clipper->TempData + 0x10)) * clipper->ItemsHeight +
             clipper->StartPosY + *(float *)((long)clipper->TempData + 8),clipper->ItemsHeight);
  return;
}

Assistant:

static void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper* clipper, int item_n)
{
    // StartPosY starts from ItemsFrozen hence the subtraction
    // Perform the add and multiply with double to allow seeking through larger ranges
    ImGuiListClipperData* data = (ImGuiListClipperData*)clipper->TempData;
    float pos_y = (float)((double)clipper->StartPosY + data->LossynessOffset + (double)(item_n - data->ItemsFrozen) * clipper->ItemsHeight);
    ImGuiListClipper_SeekCursorAndSetupPrevLine(pos_y, clipper->ItemsHeight);
}